

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

int ReconstructUV(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  ushort uVar1;
  uint8_t *puVar2;
  VP8Encoder *pVVar3;
  uint8_t *puVar4;
  DError *paaiVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  VP8Matrix *mtx;
  uint16_t *puVar9;
  uint uVar10;
  ulong uVar11;
  int16_t *piVar12;
  int8_t *piVar13;
  long lVar14;
  uint uVar15;
  int16_t (*paiVar16) [16];
  long lVar17;
  int16_t tmp [8] [16];
  int16_t local_138 [16];
  int16_t local_118 [16];
  int16_t local_f8 [16];
  int16_t local_d8 [84];
  
  puVar2 = it->yuv_in_;
  pVVar3 = it->enc_;
  uVar1 = VP8UVModeOffsets[mode];
  puVar4 = it->yuv_p_;
  uVar15 = *(byte *)it->mb_ >> 5 & 3;
  uVar11 = 0xfffffffffffffffe;
  piVar12 = local_138;
  puVar9 = VP8ScanUV;
  do {
    (*VP8FTransform2)(puVar2 + (ulong)*puVar9 + 0x10,puVar4 + (ulong)*puVar9 + (ulong)uVar1,piVar12)
    ;
    uVar11 = uVar11 + 2;
    piVar12 = piVar12 + 0x20;
    puVar9 = puVar9 + 2;
  } while (uVar11 < 6);
  if (it->top_derr_ != (DError *)0x0) {
    mtx = &pVVar3->dqm_[uVar15].uv_;
    piVar13 = rd->derr[0] + 2;
    lVar17 = 0x159;
    lVar14 = 0;
    do {
      iVar7 = it->x_;
      paaiVar5 = it->top_derr_;
      piVar12 = (int16_t *)((long)local_138 + lVar14);
      *piVar12 = *piVar12 +
                 (short)((uint)(int)(short)(paaiVar5[(long)iVar7 + -0x57][1][lVar17 + 1] * 7 +
                                           (char)it->i4_boundary_[lVar17 + -0x51] * 8) >> 3);
      iVar6 = QuantizeSingle(piVar12,mtx);
      piVar12 = (int16_t *)((long)local_118 + lVar14);
      *piVar12 = *piVar12 +
                 (short)((uint)(paaiVar5[(long)iVar7 + -0x56][0][lVar17] * 7) >> 3) + (short)iVar6;
      iVar7 = QuantizeSingle(piVar12,mtx);
      piVar12 = (int16_t *)((long)local_f8 + lVar14);
      *piVar12 = *piVar12 +
                 (short)((uint)(iVar6 * 7) >> 3) + (short)(char)it->i4_boundary_[lVar17 + -0x50];
      iVar6 = QuantizeSingle(piVar12,mtx);
      piVar12 = (int16_t *)((long)local_d8 + lVar14);
      *piVar12 = *piVar12 + (short)((uint)(iVar7 * 7) >> 3) + (short)iVar6;
      iVar8 = QuantizeSingle(piVar12,mtx);
      (*(int8_t (*) [3])(piVar13 + -2))[0] = (int8_t)iVar7;
      piVar13[-1] = (int8_t)iVar6;
      *piVar13 = (int8_t)iVar8;
      lVar14 = lVar14 + 0x80;
      piVar13 = piVar13 + 3;
      lVar17 = lVar17 + 2;
    } while (lVar14 == 0x80);
  }
  paiVar16 = rd->uv_levels;
  uVar10 = 0;
  uVar11 = 0xfffffffffffffffe;
  piVar12 = local_138;
  do {
    iVar7 = (*VP8EncQuantize2Blocks)(piVar12,*paiVar16,&pVVar3->dqm_[uVar15].uv_);
    uVar11 = uVar11 + 2;
    uVar10 = uVar10 | iVar7 << ((byte)uVar11 & 0x1f);
    paiVar16 = paiVar16 + 2;
    piVar12 = piVar12 + 0x20;
  } while (uVar11 < 6);
  uVar11 = 0xfffffffffffffffe;
  piVar12 = local_138;
  puVar9 = VP8ScanUV;
  do {
    (*VP8ITransform)(puVar4 + (ulong)*puVar9 + (ulong)uVar1,piVar12,yuv_out + *puVar9,1);
    uVar11 = uVar11 + 2;
    piVar12 = piVar12 + 0x20;
    puVar9 = puVar9 + 2;
  } while (uVar11 < 6);
  return uVar10 << 0x10;
}

Assistant:

static int ReconstructUV(VP8EncIterator* const it, VP8ModeScore* const rd,
                         uint8_t* const yuv_out, int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8UVModeOffsets[mode];
  const uint8_t* const src = it->yuv_in_ + U_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int n;
  int16_t tmp[8][16];

  for (n = 0; n < 8; n += 2) {
    VP8FTransform2(src + VP8ScanUV[n], ref + VP8ScanUV[n], tmp[n]);
  }
  if (it->top_derr_ != NULL) CorrectDCValues(it, &dqm->uv_, tmp, rd);

  if (DO_TRELLIS_UV && it->do_trellis_) {
    int ch, x, y;
    for (ch = 0, n = 0; ch <= 2; ch += 2) {
      for (y = 0; y < 2; ++y) {
        for (x = 0; x < 2; ++x, ++n) {
          const int ctx = it->top_nz_[4 + ch + x] + it->left_nz_[4 + ch + y];
          const int non_zero = TrellisQuantizeBlock(
              enc, tmp[n], rd->uv_levels[n], ctx, TYPE_CHROMA_A, &dqm->uv_,
              dqm->lambda_trellis_uv_);
          it->top_nz_[4 + ch + x] = it->left_nz_[4 + ch + y] = non_zero;
          nz |= non_zero << n;
        }
      }
    }
  } else {
    for (n = 0; n < 8; n += 2) {
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->uv_levels[n], &dqm->uv_) << n;
    }
  }

  for (n = 0; n < 8; n += 2) {
    VP8ITransform(ref + VP8ScanUV[n], tmp[n], yuv_out + VP8ScanUV[n], 1);
  }
  return (nz << 16);
}